

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O0

FFSTypeHandle_conflict FFSTypeHandle_from_encode(FFSContext c,char *buffer)

{
  FMFormat_conflict p_Var1;
  int unaff_retaddr;
  FMFormat_conflict fmf;
  FFSTypeHandle_conflict handle;
  FMContext in_stack_00000018;
  int index;
  undefined8 local_8;
  
  p_Var1 = FMformat_from_ID(in_stack_00000018,(char *)handle);
  if (p_Var1 == (FMFormat_conflict)0x0) {
    local_8 = (FFSTypeHandle_conflict)0x0;
  }
  else {
    local_8 = FFSTypeHandle_by_index((FFSContext)fmf,unaff_retaddr);
  }
  return local_8;
}

Assistant:

extern
FFSTypeHandle
FFSTypeHandle_from_encode(FFSContext c, char *buffer) 
{
    int index;
    FFSTypeHandle handle;
    /* first element in encoded buffer is format ID */
    FMFormat fmf = FMformat_from_ID(c->fmc, buffer);
    if (fmf == NULL) return NULL;
    index = fmf->format_index;
    handle = FFSTypeHandle_by_index(c, index);
    return handle;
}